

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.h
# Opt level: O0

void wabt::cat_concatenate<std::__cxx11::string,char[2],std::__cxx11::string>
               (string *s,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t,
               char (*args) [2],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_1;
  char (*args_local) [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t_local;
  string *s_local;
  
  std::__cxx11::string::operator+=((string *)s,(string *)t);
  cat_concatenate<char[2],std::__cxx11::string>(s,args,args_1);
  return;
}

Assistant:

void cat_concatenate(std::string& s, const T& t, const Ts&... args) {
    s += t;
    cat_concatenate(s, args...);
}